

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<VectorWriter,int,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>,long,long,ParamsWrapper<CNetAddr::SerParams,CService>,long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool>
               (VectorWriter *s,int *args,
               Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> *args_1,long *args_2,
               long *args_3,ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,long *args_5,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9
               ,bool *args_10)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  VectorWriter *in_RSI;
  VectorWriter *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<VectorWriter>(in_R9,0);
  Serialize<VectorWriter,_Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&>_>
            (in_R9,(Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> *)0xea2511);
  Serialize<VectorWriter>(in_R9,0xea2523);
  Serialize<VectorWriter>(in_R9,0xea2535);
  Serialize<VectorWriter,_ParamsWrapper<CNetAddr::SerParams,_CService>_>
            (in_R9,(ParamsWrapper<CNetAddr::SerParams,_CService> *)0xea2543);
  Serialize<VectorWriter>(in_R9,0xea2555);
  Serialize<VectorWriter,_ParamsWrapper<CNetAddr::SerParams,_CService>_>
            (in_R9,(ParamsWrapper<CNetAddr::SerParams,_CService> *)0xea2564);
  Serialize<VectorWriter>(in_R9,0xea2576);
  Serialize<VectorWriter,char>(in_RSI,in_RDX);
  Serialize<VectorWriter>(in_R9,0);
  Serialize<VectorWriter>(in_R9,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}